

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.c
# Opt level: O1

int spi_write(uint addr,uint len,uint8_t *data)

{
  int iVar1;
  byte bVar2;
  undefined1 uVar3;
  uint8_t msg_buf [3];
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  undefined1 *local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  uint32_t local_34;
  uint16_t local_30;
  uint8_t local_2e;
  undefined4 local_2d;
  undefined1 local_29;
  uint8_t *local_28;
  undefined8 local_20;
  uint local_18;
  uint32_t local_14;
  uint16_t local_10;
  uint8_t local_e;
  undefined4 local_d;
  undefined1 local_9;
  
  uStack_40 = 0;
  local_34 = speed;
  local_30 = delay;
  local_2e = bits;
  local_2d = 0;
  local_29 = 0;
  local_14 = speed;
  local_10 = delay;
  local_e = bits;
  local_d = 0;
  local_9 = 0;
  local_48 = &local_4b;
  local_4b = 0;
  local_4a = (undefined1)(addr >> 8);
  local_49 = (undefined1)addr;
  local_38 = 3;
  bVar2 = 4;
  if (((mode >> 9 & 1) != 0) || (bVar2 = 2, (mode >> 8 & 1) != 0)) {
    local_d = (uint)bVar2 << 8;
  }
  uVar3 = 4;
  if (((mode >> 0xb & 1) != 0) || (uVar3 = 2, (mode >> 10 & 1) != 0)) {
    local_d = (uint)CONCAT12(uVar3,(undefined2)local_d);
  }
  local_28 = data;
  if ((((mode & 0x20) == 0) && ((mode & 0x300) == 0)) && ((mode & 0xc00) != 0)) {
    local_28 = (uint8_t *)0x0;
  }
  local_20 = 0;
  local_18 = len;
  iVar1 = ioctl(i2s_fd,0x40406b00,&local_48);
  if (iVar1 < 1) {
    spi_write_cold_1();
    halt_baddata();
  }
  return 0;
}

Assistant:

static int spi_write(unsigned int addr, unsigned int len, const uint8_t *data)
{
	int ret;
	int i;
	//int out_fd;
	uint8_t msg_buf[3];
	struct spi_ioc_transfer xfer[2] = {
		{
		.tx_buf = (unsigned long)0,
		.rx_buf = (unsigned long)0,
		.len = 3,
		.delay_usecs = delay,
		.speed_hz = speed,
		.bits_per_word = bits,
		},
		{
		.tx_buf = (unsigned long)data,
		.rx_buf = (unsigned long)0,
		.len = len,
		.delay_usecs = delay,
		.speed_hz = speed,
		.bits_per_word = bits,
		}
	};
	msg_buf[0] = 0; //chip spi address
	msg_buf[1] = addr >> 8;
	msg_buf[2] = addr & 0xff;
	xfer[0].tx_buf = (unsigned long)msg_buf;
	xfer[0].len = 3;
	//printf("xfer[0].tx_buf:\n");
	//for(i = 0; i < 3; i++)
	//printf(" %.2x",*((char*)(xfer[0].tx_buf)+i));
	//printf("\n");
	
	//printf("xfer[1].tx_buf:\n");
	//for(i = 0; i < len; i++)
	//printf(" %.2x",*((char*)(xfer[1].tx_buf)+i));
	//printf("\n");

	if (mode & SPI_TX_QUAD)
		xfer[1].tx_nbits = 4;
	else if (mode & SPI_TX_DUAL)
		xfer[1].tx_nbits = 2;
	if (mode & SPI_RX_QUAD)
		xfer[1].rx_nbits = 4;
	else if (mode & SPI_RX_DUAL)
		xfer[1].rx_nbits = 2;
	if (!(mode & SPI_LOOP)) {
		if (mode & (SPI_TX_QUAD | SPI_TX_DUAL))
			xfer[1].rx_buf = 0;
		else if (mode & (SPI_RX_QUAD | SPI_RX_DUAL))
			xfer[1].tx_buf = 0;
	}

	ret = ioctl(i2s_fd, SPI_IOC_MESSAGE(2), xfer);
	if (ret < 1) {
		pabort("write: can't send spi message");
		return 1;
	}
	return 0;
}